

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O0

ostream * binlog::operator<<(ostream *out,WriterProp *a)

{
  ostream *poVar1;
  ulong *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"WriterProp{");
  poVar1 = std::operator<<(poVar1," id: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," name: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 1));
  poVar1 = std::operator<<(poVar1," batchSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[5]);
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const WriterProp& a)
{
  return
  out << "WriterProp{"
      << " id: " << a.id
      << " name: " << a.name
      << " batchSize: " << a.batchSize << " }";
}